

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

void m256v_LU_invmult_inplace(m256v *LU,int rank,int *rowperm,int *inv_colperm,m256v *X_inout)

{
  int *in_RCX;
  int *in_RDX;
  int in_ESI;
  int *in_RDI;
  m256v Y;
  m256v X;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  m256v *in_stack_ffffffffffffffc0;
  
  if (in_ESI == -1) {
    if (in_RDI[1] < *in_RDI) {
      in_stack_ffffffffffffffa4 = in_RDI[1];
    }
    else {
      in_stack_ffffffffffffffa4 = *in_RDI;
    }
  }
  m256v_get_subview(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                    in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  m256v_get_subview(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                    in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  if (in_RDX != (int *)0x0) {
    m256v_permute_rows((m256v *)&stack0xffffffffffffffa8,in_RDX);
  }
  m256v_L_invmult_inplace
            ((m256v *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff9c,(m256v *)0x1040a8);
  m256v_U_invmult_inplace
            ((m256v *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff9c,(m256v *)0x1040bb);
  if (in_RCX != (int *)0x0) {
    m256v_permute_rows((m256v *)&stack0xffffffffffffffc0,in_RCX);
  }
  return;
}

Assistant:

void MV_GEN_N(_LU_invmult_inplace)(const MV_GEN_TYPE* LU,
				int rank,
				const int* rowperm,
				const int* inv_colperm,
				MV_GEN_TYPE* X_inout)
{
	/* If the rank is unspecified (-1), we assume the max rank */
	if (rank == -1)
		rank = (LU->n_col < LU->n_row ? LU->n_col : LU->n_row);

	/* Create adequate views */
	assert(LU->n_col <= X_inout->n_row);
	assert(LU->n_row <= X_inout->n_row);
	MV_GEN_TYPE X = MV_GEN_N(_get_subview)(X_inout, 0, 0, LU->n_col, X_inout->n_col);
	MV_GEN_TYPE Y = MV_GEN_N(_get_subview)(X_inout, 0, 0, LU->n_row, X_inout->n_col);

	/* Apply the row permutation */
	if (rowperm != NULL) {
		MV_GEN_N(_permute_rows)(&Y, rowperm);
	}

	MV_GEN_N(_L_invmult_inplace)(LU, rank, &Y);
	MV_GEN_N(_U_invmult_inplace)(LU, rank, &X);

	/* Apply the column permutation */
	if (inv_colperm != NULL) {
		MV_GEN_N(_permute_rows)(&X, inv_colperm);
	}
}